

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForbiddenPointFinder.cpp
# Opt level: O2

bool __thiscall ForbiddenPointFinder::isOverline(ForbiddenPointFinder *this,int x,int y)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Stone *pSVar4;
  uint uVar5;
  uint uVar6;
  Stone *pSVar7;
  Stone (*paSVar8) [17];
  long lVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  
  iVar2 = x + 1;
  if (this->cBoard[iVar2][(long)y + 1] != Empty) {
    return false;
  }
  pSVar4 = this->cBoard[iVar2] + (long)y + 1;
  *pSVar4 = Black;
  uVar3 = 1;
  uVar10 = x;
  while ((0 < (int)uVar10 && (this->cBoard[uVar10][(long)y + 1] == Black))) {
    uVar10 = uVar10 - 1;
    uVar3 = uVar3 + 1;
  }
  lVar9 = (long)(x + 2);
  lVar13 = lVar9;
  for (pSVar7 = this->cBoard[lVar9] + (long)y + 1; (lVar13 < 0x10 && (*pSVar7 == Black));
      pSVar7 = pSVar7 + 0x11) {
    lVar13 = lVar13 + 1;
    uVar3 = uVar3 + 1;
  }
  if (uVar3 != 5) {
    uVar5 = 1;
    for (uVar10 = y; (0 < (int)uVar10 && (this->cBoard[iVar2][uVar10] == Black));
        uVar10 = uVar10 - 1) {
      uVar5 = uVar5 + 1;
    }
    lVar11 = (long)(y + 2);
    for (lVar13 = lVar11; (lVar13 < 0x10 && (this->cBoard[(long)x + 1][lVar13] == Black));
        lVar13 = lVar13 + 1) {
      uVar5 = uVar5 + 1;
    }
    if (uVar5 != 5) {
      uVar6 = 1;
      uVar10 = x;
      for (uVar12 = y;
          ((0 < (int)uVar10 && (0 < (int)uVar12)) && (this->cBoard[uVar10][uVar12] == Black));
          uVar12 = uVar12 - 1) {
        uVar10 = uVar10 - 1;
        uVar6 = uVar6 + 1;
      }
      lVar13 = lVar11;
      lVar14 = lVar9;
      for (pSVar7 = this->cBoard[lVar9] + lVar11;
          ((lVar14 < 0x10 && (lVar13 < 0x10)) && (*pSVar7 == Black)); pSVar7 = pSVar7 + 0x12) {
        lVar13 = lVar13 + 1;
        lVar14 = lVar14 + 1;
        uVar6 = uVar6 + 1;
      }
      if (uVar6 != 5) {
        uVar10 = 1;
        for (pSVar7 = this->cBoard[0] + lVar11;
            ((0 < x && (lVar11 < 0x10)) && (pSVar7[(ulong)(uint)x * 0x11] == Black));
            pSVar7 = pSVar7 + 1) {
          lVar11 = lVar11 + 1;
          x = x - 1;
          uVar10 = uVar10 + 1;
        }
        for (paSVar8 = this->cBoard + lVar9;
            ((lVar9 < 0x10 && (0 < y)) && ((*paSVar8)[(uint)y] == Black)); paSVar8 = paSVar8 + 1) {
          y = y - 1;
          lVar9 = lVar9 + 1;
          uVar10 = uVar10 + 1;
        }
        if (uVar10 != 5) {
          bVar1 = ((5 < uVar5 || 5 < uVar3) || 5 < uVar6) || 5 < uVar10;
          goto LAB_00102af5;
        }
      }
    }
  }
  bVar1 = false;
LAB_00102af5:
  *pSVar4 = Empty;
  return bVar1;
}

Assistant:

bool ForbiddenPointFinder::isOverline(int x, int y) {
    if (cBoard[x + 1][y + 1] != Stone::Empty)
        return false;

    setStone(x, y, Stone::Black);

    // detect black overline
    int i, j;
    bool bOverline = false;

    // 1 - horizontal direction
    int nLine = 1;
    i = x;
    while (i > 0) {
        if (cBoard[i--][y + 1] == Stone::Black)
            nLine++;
        else
            break;
    }
    i = x + 2;
    while (i < (BoardSize + 1)) {
        if (cBoard[i++][y + 1] == Stone::Black)
            nLine++;
        else
            break;
    }
    if (nLine == 5) {
        setStone(x, y, Stone::Empty);
        return false;
    } else
        bOverline |= (nLine >= 6);

    // 2 - vertical direction
    nLine = 1;
    i = y;
    while (i > 0) {
        if (cBoard[x + 1][i--] == Stone::Black)
            nLine++;
        else
            break;
    }
    i = y + 2;
    while (i < (BoardSize + 1)) {
        if (cBoard[x + 1][i++] == Stone::Black)
            nLine++;
        else
            break;
    }
    if (nLine == 5) {
        setStone(x, y, Stone::Empty);
        return false;
    } else
        bOverline |= (nLine >= 6);

    // 3 - diagonal direction (lower-left to upper-right: '/')
    nLine = 1;
    i = x;
    j = y;
    while ((i > 0) && (j > 0)) {
        if (cBoard[i--][j--] == Stone::Black)
            nLine++;
        else
            break;
    }
    i = x + 2;
    j = y + 2;
    while ((i < (BoardSize + 1)) && (j < (BoardSize + 1))) {
        if (cBoard[i++][j++] == Stone::Black)
            nLine++;
        else
            break;
    }
    if (nLine == 5) {
        setStone(x, y, Stone::Empty);
        return false;
    } else
        bOverline |= (nLine >= 6);

    // 4 - diagonal direction (upper-left to lower-right: '\')
    nLine = 1;
    i = x;
    j = y + 2;
    while ((i > 0) && (j < (BoardSize + 1))) {
        if (cBoard[i--][j++] == Stone::Black)
            nLine++;
        else
            break;
    }
    i = x + 2;
    j = y;
    while ((i < (BoardSize + 1)) && (j > 0)) {
        if (cBoard[i++][j--] == Stone::Black)
            nLine++;
        else
            break;
    }
    if (nLine == 5) {
        setStone(x, y, Stone::Empty);
        return false;
    } else
        bOverline |= (nLine >= 6);

    setStone(x, y, Stone::Empty);
    return bOverline;
}